

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O2

pdu_cache_response * begin_cache_response(uint8_t version,uint16_t session_id)

{
  char *pcVar1;
  pdu_cache_response *ppVar2;
  size_t sVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  
  ppVar2 = *(pdu_cache_response **)(in_FS_OFFSET + 0x28);
  if (data == (char *)0x0) {
    pcVar6 = (char *)lrtr_malloc(8);
  }
  else {
    pcVar6 = (char *)lrtr_realloc(data,data_size + 8);
  }
  sVar3 = data_size;
  data = pcVar6;
  if (pcVar6 != (char *)0x0) {
    pcVar1 = pcVar6 + data_size;
    pcVar1[0] = '\x02';
    pcVar1[1] = '\x03';
    uVar4 = lrtr_convert_short(TO_HOST_HOST_BYTE_ORDER,0);
    *(uint16_t *)(pcVar6 + sVar3 + 2) = uVar4;
    uVar5 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,8);
    *(uint32_t *)(pcVar6 + sVar3 + 4) = uVar5;
    data_size = data_size + 8;
    if (*(pdu_cache_response **)(in_FS_OFFSET + 0x28) == ppVar2) {
      return *(pdu_cache_response **)(in_FS_OFFSET + 0x28);
    }
    __stack_chk_fail();
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                ,0x78,"struct pdu_cache_response *begin_cache_response(uint8_t, uint16_t)");
}

Assistant:

static struct pdu_cache_response *begin_cache_response(uint8_t version, uint16_t session_id)
{
	if (!data)
		data = lrtr_malloc(sizeof(struct pdu_cache_response));
	else
		data = lrtr_realloc(data, data_size + sizeof(struct pdu_cache_response));

	assert(data);

	struct pdu_cache_response *cache_response = (struct pdu_cache_response *)(data + data_size);

	cache_response->ver = version;
	cache_response->type = CACHE_RESPONSE;
	cache_response->session_id = BYTES16(session_id);
	cache_response->len = BYTES32(8);

	data_size += sizeof(struct pdu_cache_response);

	return cache_response;
}